

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseTopOrGroup
          (StructTranslator *this,Reader members,MemberInfo *parent,StructOrGroup *layout)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> **pppMVar1;
  MemberInfo **ppMVar2;
  MemberInfo **ppMVar3;
  Reader parent_00;
  Reader members_00;
  Reader parent_01;
  Reader members_01;
  Reader decl;
  Reader decl_00;
  bool bVar4;
  short sVar5;
  int iVar6;
  MemberInfo *parent_02;
  uint *codeOrder_00;
  size_t sVar7;
  ElementCount index;
  Reader RVar8;
  uint codeOrder;
  uint independentSubCodeOrder;
  Reader member;
  uint local_1e8;
  bool local_1e1;
  MemberInfo *local_1e0;
  uint local_1d4;
  PointerReader local_1d0;
  multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  *local_1b0;
  StructReader local_1a8;
  Arena *local_178;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_170;
  StructOrGroup *local_168;
  ElementCount local_15c;
  StructBuilder *local_158;
  Union *local_150;
  NodeSourceInfoBuilderPair local_148;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_f8;
  ListReader local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ListReader local_90;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1e8 = 0;
  local_15c = members.reader.elementCount;
  if (members.reader.elementCount != 0) {
    local_178 = &this->arena;
    local_158 = &(parent->node)._builder;
    local_170 = &this->allMembers;
    local_1b0 = &this->membersByOrdinal;
    index = 0;
    local_1e0 = parent;
    local_168 = layout;
    local_f8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)local_1b0;
    do {
      capnp::_::ListReader::getStructElement(&local_1a8,&members.reader,index);
      if (local_1a8.dataSize < 0x20) {
        sVar5 = 0;
      }
      else {
        sVar5 = *(short *)((long)local_1a8.data + 2);
      }
      if (sVar5 == 8) {
        local_1e0->childCount = local_1e0->childCount + 1;
        local_1d0.segment = (SegmentReader *)CONCAT44(local_1d0.segment._4_4_,local_1e8);
        local_1e8 = local_1e8 + 1;
        capnp::_::StructBuilder::asReader(local_158);
        decl._reader.pointerCount = local_1a8.pointerCount;
        decl._reader.dataSize = local_1a8.dataSize;
        decl._reader._38_2_ = local_1a8._38_2_;
        decl._reader._44_4_ = local_1a8._44_4_;
        decl._reader.nestingLimit = local_1a8.nestingLimit;
        parent_00._reader.capTable = (CapTableReader *)uStack_b8;
        parent_00._reader.segment = (SegmentReader *)local_c0;
        parent_00._reader.data = (void *)local_b0;
        parent_00._reader.pointers = (WirePointer *)uStack_a8;
        parent_00._reader.dataSize = (undefined4)local_a0;
        parent_00._reader.pointerCount = local_a0._4_2_;
        parent_00._reader._38_2_ = local_a0._6_2_;
        parent_00._reader._40_8_ = uStack_98;
        decl._reader.capTable = local_1a8.capTable;
        decl._reader.segment = local_1a8.segment;
        decl._reader.data = local_1a8.data;
        decl._reader.pointers = local_1a8.pointers;
        newGroupNode(&local_148,this,parent_00,decl);
        local_1d4 = local_1d4 & 0xffffff00;
        parent_02 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                              (local_178,local_1e0,(uint *)&local_1d0,(Reader *)&local_1a8,
                               &local_148,(bool *)&local_1d4);
        ppMVar2 = (this->allMembers).builder.endPtr;
        if ((this->allMembers).builder.pos == ppMVar2) {
          ppMVar3 = (local_170->builder).ptr;
          sVar7 = (long)ppMVar2 - (long)ppMVar3 >> 2;
          if (ppMVar2 == ppMVar3) {
            sVar7 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                    (local_170,sVar7);
        }
        *(this->allMembers).builder.pos = parent_02;
        pppMVar1 = &(this->allMembers).builder.pos;
        *pppMVar1 = *pppMVar1 + 1;
        if (local_1a8.pointerCount < 3) {
          local_148.node._builder.pointers._0_4_ = 0x7fffffff;
          local_148.node._builder.capTable = (CapTableBuilder *)0x0;
          local_148.node._builder.data = (WirePointer *)0x0;
          local_148.node._builder.segment = (SegmentBuilder *)0x0;
        }
        else {
          local_148.node._builder.data = local_1a8.pointers + 2;
          local_148.node._builder.capTable = (CapTableBuilder *)local_1a8.capTable;
          local_148.node._builder.segment = (SegmentBuilder *)local_1a8.segment;
          local_148.node._builder.pointers._0_4_ = local_1a8.nestingLimit;
        }
        bVar4 = false;
        capnp::_::PointerReader::getList
                  (&local_f0,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
        members_00.reader.capTable = local_f0.capTable;
        members_00.reader.segment = local_f0.segment;
        members_00.reader.ptr = local_f0.ptr;
        members_00.reader.elementCount = local_f0.elementCount;
        members_00.reader.step = local_f0.step;
        members_00.reader.structDataSize = local_f0.structDataSize;
        members_00.reader.structPointerCount = local_f0.structPointerCount;
        members_00.reader.elementSize = local_f0.elementSize;
        members_00.reader._39_1_ = local_f0._39_1_;
        members_00.reader.nestingLimit = local_f0.nestingLimit;
        members_00.reader._44_4_ = local_f0._44_4_;
        traverseGroup(this,members_00,parent_02,local_168);
      }
      else {
        if (sVar5 == 7) {
          local_150 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&>
                                (local_178,local_168);
          local_1d4 = 0;
          local_1d0.capTable = local_1a8.capTable;
          local_1d0.pointer = local_1a8.pointers;
          local_1d0.segment = local_1a8.segment;
          local_1d0.nestingLimit = local_1a8.nestingLimit;
          if (local_1a8.pointerCount == 0) {
            local_1d0.capTable = (CapTableReader *)(MemberInfo *)0x0;
            local_1d0.pointer = (WirePointer *)0x0;
            local_1d0.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
            local_1d0.nestingLimit = 0x7fffffff;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_1d0,(word *)0x0);
          if (local_148.node._builder.pointerCount == 0) {
            local_1d0.nestingLimit = 0x7fffffff;
            local_1d0.capTable = (CapTableReader *)0x0;
            local_1d0.pointer = (WirePointer *)0x0;
            local_1d0.segment = (SegmentReader *)0x0;
          }
          else {
            local_1d0.pointer =
                 (WirePointer *)
                 CONCAT44(local_148.node._builder.pointers._4_4_,
                          (int)local_148.node._builder.pointers);
            local_1d0.capTable = &(local_148.node._builder.capTable)->super_CapTableReader;
            local_1d0.segment = &(local_148.node._builder.segment)->super_SegmentReader;
            local_1d0.nestingLimit = (int)local_148.sourceInfo._builder.segment;
          }
          RVar8 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1d0,(void *)0x0,0);
          if (RVar8.super_StringPtr.content.size_ == 1) {
            iVar6 = bcmp(RVar8.super_StringPtr.content.ptr,"",1);
            codeOrder_00 = &local_1e8;
            parent_02 = local_1e0;
            if (iVar6 != 0) goto LAB_003e7286;
          }
          else {
LAB_003e7286:
            local_1e0->childCount = local_1e0->childCount + 1;
            local_1d0.segment = (SegmentReader *)CONCAT44(local_1d0.segment._4_4_,local_1e8);
            local_1e8 = local_1e8 + 1;
            capnp::_::StructBuilder::asReader(local_158);
            decl_00._reader.pointerCount = local_1a8.pointerCount;
            decl_00._reader.dataSize = local_1a8.dataSize;
            decl_00._reader._38_2_ = local_1a8._38_2_;
            decl_00._reader._44_4_ = local_1a8._44_4_;
            decl_00._reader.nestingLimit = local_1a8.nestingLimit;
            parent_01._reader.capTable = (CapTableReader *)uStack_58;
            parent_01._reader.segment = (SegmentReader *)local_60;
            parent_01._reader.data = (void *)local_50;
            parent_01._reader.pointers = (WirePointer *)uStack_48;
            parent_01._reader.dataSize = (undefined4)local_40;
            parent_01._reader.pointerCount = local_40._4_2_;
            parent_01._reader._38_2_ = local_40._6_2_;
            parent_01._reader._40_8_ = uStack_38;
            decl_00._reader.capTable = local_1a8.capTable;
            decl_00._reader.segment = local_1a8.segment;
            decl_00._reader.data = local_1a8.data;
            decl_00._reader.pointers = local_1a8.pointers;
            newGroupNode(&local_148,this,parent_01,decl_00);
            local_1e1 = false;
            parent_02 = kj::Arena::
                        allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                                  (local_178,local_1e0,(uint *)&local_1d0,(Reader *)&local_1a8,
                                   &local_148,&local_1e1);
            ppMVar2 = (this->allMembers).builder.endPtr;
            if ((this->allMembers).builder.pos == ppMVar2) {
              ppMVar3 = (local_170->builder).ptr;
              sVar7 = (long)ppMVar2 - (long)ppMVar3 >> 2;
              if (ppMVar2 == ppMVar3) {
                sVar7 = 4;
              }
              kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::
              setCapacity(local_170,sVar7);
            }
            *(this->allMembers).builder.pos = parent_02;
            pppMVar1 = &(this->allMembers).builder.pos;
            *pppMVar1 = *pppMVar1 + 1;
            codeOrder_00 = &local_1d4;
          }
          (parent_02->field_21).unionScope = local_150;
          if (local_1a8.pointerCount < 3) {
            local_148.node._builder.pointers._0_4_ = 0x7fffffff;
            local_148.node._builder.capTable = (CapTableBuilder *)0x0;
            local_148.node._builder.data = (WirePointer *)0x0;
            local_148.node._builder.segment = (SegmentBuilder *)0x0;
          }
          else {
            local_148.node._builder.data = local_1a8.pointers + 2;
            local_148.node._builder.capTable = (CapTableBuilder *)local_1a8.capTable;
            local_148.node._builder.segment = (SegmentBuilder *)local_1a8.segment;
            local_148.node._builder.pointers._0_4_ = local_1a8.nestingLimit;
          }
          capnp::_::PointerReader::getList
                    (&local_90,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
          members_01.reader.capTable = local_90.capTable;
          members_01.reader.segment = local_90.segment;
          members_01.reader.ptr = local_90.ptr;
          members_01.reader.elementCount = local_90.elementCount;
          members_01.reader.step = local_90.step;
          members_01.reader.structDataSize = local_90.structDataSize;
          members_01.reader.structPointerCount = local_90.structPointerCount;
          members_01.reader.elementSize = local_90.elementSize;
          members_01.reader._39_1_ = local_90._39_1_;
          members_01.reader.nestingLimit = local_90.nestingLimit;
          members_01.reader._44_4_ = local_90._44_4_;
          traverseUnion(this,(Reader *)&local_1a8,members_01,parent_02,local_150,codeOrder_00);
          if ((local_1a8.dataSize < 0x10) || (*local_1a8.data != 2)) {
            bVar4 = false;
            goto LAB_003e748d;
          }
          if (local_1a8.pointerCount < 2) {
            local_1d0.nestingLimit = 0x7fffffff;
            local_1d0.capTable = (CapTableReader *)0x0;
            local_1d0.pointer = (WirePointer *)0x0;
            local_1d0.segment = (SegmentReader *)0x0;
          }
          else {
            local_1d0.pointer = local_1a8.pointers + 1;
            local_1d0.capTable = local_1a8.capTable;
            local_1d0.segment = local_1a8.segment;
            local_1d0.nestingLimit = local_1a8.nestingLimit;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_1d0,(word *)0x0);
          local_1b0 = (multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
                       *)0x0;
        }
        else {
          if (sVar5 != 6) {
            bVar4 = false;
            parent_02 = (MemberInfo *)0x0;
            goto LAB_003e748d;
          }
          local_1e0->childCount = local_1e0->childCount + 1;
          local_148.node._builder.segment =
               (SegmentBuilder *)CONCAT44(local_148.node._builder.segment._4_4_,local_1e8);
          local_1d0.segment = (SegmentReader *)((ulong)local_1d0.segment & 0xffffffffffffff00);
          local_1e8 = local_1e8 + 1;
          parent_02 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                                (local_178,local_1e0,(uint *)&local_148,(Reader *)&local_1a8,
                                 local_168,(bool *)&local_1d0);
          ppMVar2 = (this->allMembers).builder.endPtr;
          if ((this->allMembers).builder.pos == ppMVar2) {
            ppMVar3 = (local_170->builder).ptr;
            sVar7 = (long)ppMVar2 - (long)ppMVar3 >> 2;
            if (ppMVar2 == ppMVar3) {
              sVar7 = 4;
            }
            kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                      (local_170,sVar7);
          }
          *(this->allMembers).builder.pos = parent_02;
          pppMVar1 = &(this->allMembers).builder.pos;
          *pppMVar1 = *pppMVar1 + 1;
          if (local_1a8.pointerCount < 2) {
            local_1d0.nestingLimit = 0x7fffffff;
            local_1d0.capTable = (CapTableReader *)0x0;
            local_1d0.pointer = (WirePointer *)0x0;
            local_1d0.segment = (SegmentReader *)0x0;
          }
          else {
            local_1d0.pointer = local_1a8.pointers + 1;
            local_1d0.capTable = local_1a8.capTable;
            local_1d0.segment = local_1a8.segment;
            local_1d0.nestingLimit = local_1a8.nestingLimit;
          }
          local_1b0 = (multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
                       *)0x0;
          capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_1d0,(word *)0x0);
        }
        if (0x3f < local_148.node._builder.dataSize) {
          local_1b0 = (multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
                       *)(ulong)((WireValue<uint32_t>_conflict *)local_148.node._builder.data)->
                                value;
        }
        bVar4 = true;
      }
LAB_003e748d:
      if (bVar4) {
        local_148.node._builder.segment =
             (SegmentBuilder *)CONCAT44(local_148.node._builder.segment._4_4_,(int)local_1b0);
        local_148.node._builder.capTable = (CapTableBuilder *)parent_02;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
        ::
        _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                  (local_f8,(pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
                             *)&local_148);
      }
      index = index + 1;
    } while (local_15c != index);
  }
  return;
}

Assistant:

void traverseTopOrGroup(List<Declaration>::Reader members, MemberInfo& parent,
                          StructLayout::StructOrGroup& layout) {
    uint codeOrder = 0;

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member, layout, false);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION: {
          StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(layout);

          uint independentSubCodeOrder = 0;
          uint* subCodeOrder = &independentSubCodeOrder;
          if (member.getName().getValue() == "") {
            memberInfo = &parent;
            subCodeOrder = &codeOrder;
          } else {
            parent.childCount++;
            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                false);
            allMembers.add(memberInfo);
          }
          memberInfo->unionScope = &unionLayout;
          traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, *subCodeOrder);
          if (member.getId().isOrdinal()) {
            ordinal = member.getId().getOrdinal().getValue();
          }
          break;
        }

        case Declaration::GROUP:
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              false);
          allMembers.add(memberInfo);

          // Members of the group are laid out just like they were members of the parent, so we
          // just pass along the parent layout.
          traverseGroup(member.getNestedDecls(), *memberInfo, layout);

          // No ordinal for groups.
          break;

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }